

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O0

adt_error_t adt_bytearray_reserve(adt_bytearray_t *self,uint32_t u32NewLen)

{
  adt_error_t errorCode;
  uint32_t u32NewLen_local;
  adt_bytearray_t *self_local;
  
  if (self == (adt_bytearray_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else if ((u32NewLen <= self->u32AllocLen) ||
          (self_local._7_1_ = adt_bytearray_grow(self,u32NewLen), self_local._7_1_ == '\0')) {
    self_local._7_1_ = '\0';
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_bytearray_reserve(adt_bytearray_t *self, uint32_t u32NewLen){
   if(self){
      if(u32NewLen > self->u32AllocLen){
         adt_error_t errorCode = adt_bytearray_grow(self,u32NewLen);
         if(errorCode != ADT_NO_ERROR){
            return errorCode;
         }
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}